

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5StorageDocsize(Fts5Storage *p,i64 iRowid,int *aCol)

{
  uint uVar1;
  sqlite3_stmt *pStmt;
  int iVar2;
  uint uVar3;
  int iVar4;
  Mem *pVal;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  sqlite3_stmt *pLookup;
  sqlite3_stmt *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = p->pConfig->nCol;
  uVar6 = (ulong)uVar1;
  local_40 = (sqlite3_stmt *)0x0;
  iVar2 = fts5StorageGetStmt(p,9,&local_40,(char **)0x0);
  pStmt = local_40;
  if (local_40 != (sqlite3_stmt *)0x0) {
    sqlite3_bind_int64(local_40,1,iRowid);
    iVar2 = sqlite3_step(pStmt);
    bVar8 = true;
    if (iVar2 == 100) {
      uVar7 = 0;
      pVal = columnMem(pStmt,0);
      pvVar5 = sqlite3_value_blob(pVal);
      columnMallocFailure(pStmt);
      uVar3 = sqlite3_column_bytes(pStmt,0);
      if (0 < (int)uVar1) {
        uVar7 = 0;
        do {
          if ((int)uVar3 <= (int)uVar7) {
            bVar8 = true;
            goto LAB_001eef8d;
          }
          iVar2 = sqlite3Fts5GetVarint32((uchar *)((ulong)uVar7 + (long)pvVar5),(u32 *)aCol);
          uVar7 = uVar7 + iVar2;
          aCol = (int *)((u32 *)aCol + 1);
          uVar6 = uVar6 - 1;
        } while (uVar6 != 0);
      }
      bVar8 = uVar7 != uVar3;
    }
LAB_001eef8d:
    iVar4 = sqlite3_reset(pStmt);
    iVar2 = 0x10b;
    if (iVar4 != 0) {
      iVar2 = iVar4;
    }
    if (!bVar8) {
      iVar2 = iVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5StorageDocsize(Fts5Storage *p, i64 iRowid, int *aCol){
  int nCol = p->pConfig->nCol;    /* Number of user columns in table */
  sqlite3_stmt *pLookup = 0;      /* Statement to query %_docsize */
  int rc;                         /* Return Code */

  assert( p->pConfig->bColumnsize );
  rc = fts5StorageGetStmt(p, FTS5_STMT_LOOKUP_DOCSIZE, &pLookup, 0);
  if( pLookup ){
    int bCorrupt = 1;
    assert( rc==SQLITE_OK );
    sqlite3_bind_int64(pLookup, 1, iRowid);
    if( SQLITE_ROW==sqlite3_step(pLookup) ){
      const u8 *aBlob = sqlite3_column_blob(pLookup, 0);
      int nBlob = sqlite3_column_bytes(pLookup, 0);
      if( 0==fts5StorageDecodeSizeArray(aCol, nCol, aBlob, nBlob) ){
        bCorrupt = 0;
      }
    }
    rc = sqlite3_reset(pLookup);
    if( bCorrupt && rc==SQLITE_OK ){
      rc = FTS5_CORRUPT;
    }
  }else{
    assert( rc!=SQLITE_OK );
  }

  return rc;
}